

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_assertEqualCParams
               (ZSTD_compressionParameters cParams1,ZSTD_compressionParameters cParams2)

{
  ZSTD_strategy in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_0000002c;
  
  if (in_stack_00000008 != cParams1.strategy) {
    __assert_fail("cParams1.windowLog == cParams2.windowLog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x57f6,
                  "void ZSTD_assertEqualCParams(ZSTD_compressionParameters, ZSTD_compressionParameters)"
                 );
  }
  if (in_stack_0000000c != in_stack_0000002c) {
    __assert_fail("cParams1.chainLog == cParams2.chainLog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x57f7,
                  "void ZSTD_assertEqualCParams(ZSTD_compressionParameters, ZSTD_compressionParameters)"
                 );
  }
  if (cParams1.windowLog != cParams2.windowLog) {
    __assert_fail("cParams1.hashLog == cParams2.hashLog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x57f8,
                  "void ZSTD_assertEqualCParams(ZSTD_compressionParameters, ZSTD_compressionParameters)"
                 );
  }
  if (cParams1.chainLog == cParams2.chainLog) {
    if (cParams1.hashLog != cParams2.hashLog) {
      __assert_fail("cParams1.minMatch == cParams2.minMatch",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x57fa,
                    "void ZSTD_assertEqualCParams(ZSTD_compressionParameters, ZSTD_compressionParameters)"
                   );
    }
    if (cParams1.searchLog == cParams2.searchLog) {
      if (cParams1.minMatch == cParams2.minMatch) {
        return;
      }
      __assert_fail("cParams1.strategy == cParams2.strategy",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x57fc,
                    "void ZSTD_assertEqualCParams(ZSTD_compressionParameters, ZSTD_compressionParameters)"
                   );
    }
    __assert_fail("cParams1.targetLength == cParams2.targetLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x57fb,
                  "void ZSTD_assertEqualCParams(ZSTD_compressionParameters, ZSTD_compressionParameters)"
                 );
  }
  __assert_fail("cParams1.searchLog == cParams2.searchLog",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x57f9,
                "void ZSTD_assertEqualCParams(ZSTD_compressionParameters, ZSTD_compressionParameters)"
               );
}

Assistant:

static void ZSTD_assertEqualCParams(ZSTD_compressionParameters cParams1,
                                    ZSTD_compressionParameters cParams2)
{
    (void)cParams1;
    (void)cParams2;
    assert(cParams1.windowLog    == cParams2.windowLog);
    assert(cParams1.chainLog     == cParams2.chainLog);
    assert(cParams1.hashLog      == cParams2.hashLog);
    assert(cParams1.searchLog    == cParams2.searchLog);
    assert(cParams1.minMatch     == cParams2.minMatch);
    assert(cParams1.targetLength == cParams2.targetLength);
    assert(cParams1.strategy     == cParams2.strategy);
}